

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

SC_Lib * Abc_SclReadFromStr(Vec_Str_t *vOut)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined8 uVar6;
  char **ppVarNames;
  word *pwVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  SC_Lib *pSVar11;
  size_t sVar12;
  char *pcVar13;
  void **ppvVar14;
  void *pvVar15;
  char *pcVar16;
  long *plVar17;
  Vec_Int_t *pVVar18;
  char *pcVar19;
  uint *__ptr;
  Vec_Wrd_t *pVVar20;
  void *pvVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  word Val;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  int Pos;
  uint local_74;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  SC_Lib *local_58;
  long *local_50;
  Vec_Str_t *local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  
  local_74 = 0;
  iVar32 = 1;
  pSVar11 = (SC_Lib *)calloc(1,0x90);
  pSVar11->default_max_out_slew = -1.0;
  pSVar11->unit_time = 9;
  pSVar11->unit_cap_fst = 1.0;
  pSVar11->unit_cap_snd = 0xc;
  local_74 = 1;
  uVar36 = vOut->nSize;
  uVar23 = local_74;
  if (0 < (int)uVar36) {
    pcVar19 = vOut->pArray;
    uVar26 = 0;
    bVar22 = 0;
    uVar8 = 0;
    do {
      bVar1 = pcVar19[uVar26];
      if (-1 < (char)bVar1) {
        local_3c = (uint)bVar1 << (bVar22 & 0x1f) | uVar8;
        local_58 = pSVar11;
        if (local_3c != 8) {
          Abc_Print(iVar32,(char *)(ulong)local_3c);
          uVar23 = local_38;
          goto LAB_0043b38b;
        }
        uVar26 = (ulong)local_74;
        if (uVar36 <= local_74) goto LAB_0043b3cb;
        uVar8 = local_74;
        if (local_74 < uVar36) {
          uVar8 = uVar36;
        }
        goto LAB_0043982d;
      }
      uVar8 = uVar8 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
      local_74 = (int)uVar26 + 2;
      bVar22 = bVar22 + 7;
      uVar26 = uVar26 + 1;
      uVar23 = local_74;
    } while (uVar36 != uVar26);
  }
  goto LAB_0043a4a3;
  while( true ) {
    bVar1 = pcVar19[uVar30];
    if (-1 < (char)bVar1) {
      local_58->unit_cap_snd = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
      uVar8 = local_74 + 1;
      uVar23 = uVar8;
      if (-1 < (int)local_74) {
        if ((int)uVar36 <= (int)local_74) {
          uVar36 = local_74;
        }
        bVar22 = 0;
        uVar30 = 0;
        uVar33 = local_74;
        local_74 = uVar8;
        goto LAB_00439b11;
      }
      break;
    }
    uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar30 + 2;
    uVar30 = uVar30 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar8 < 0) break;
LAB_00439ab9:
    uVar23 = local_74;
    if (uVar36 == uVar30) break;
  }
  goto LAB_0043a4a3;
  while( true ) {
    bVar1 = pcVar19[uVar33];
    if (-1 < (char)bVar1) {
      uVar30 = (uint)bVar1 << (bVar22 & 0x1f) | uVar30;
      local_48 = vOut;
      uVar36 = local_74;
      goto joined_r0x00439b4c;
    }
    uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar33 + 2;
    uVar33 = uVar33 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar8 < 0) break;
LAB_00439b11:
    uVar23 = local_74;
    if (uVar36 == uVar33) break;
  }
  goto LAB_0043a4a3;
joined_r0x00439b4c:
  if (uVar30 == 0) goto LAB_00439f4b;
  uVar26 = (ulong)local_68 >> 0x20;
  local_68 = (char *)CONCAT44((int)uVar26,uVar30);
  local_74 = uVar36;
  local_70 = (char *)calloc(1,0x30);
  uVar23 = (local_58->vWireLoads).nCap;
  if ((local_58->vWireLoads).nSize == uVar23) {
    if ((int)uVar23 < 0x10) {
      ppvVar14 = (local_58->vWireLoads).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,0x80);
      }
      iVar32 = 0x10;
    }
    else {
      iVar32 = uVar23 * 2;
      if (iVar32 <= (int)uVar23) goto LAB_00439bd8;
      ppvVar14 = (local_58->vWireLoads).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar23 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,(ulong)uVar23 << 4);
      }
    }
    (local_58->vWireLoads).pArray = ppvVar14;
    (local_58->vWireLoads).nCap = iVar32;
  }
LAB_00439bd8:
  iVar32 = (local_58->vWireLoads).nSize;
  (local_58->vWireLoads).nSize = iVar32 + 1;
  (local_58->vWireLoads).pArray[iVar32] = local_70;
  lVar29 = (long)(int)local_74;
  if ((lVar29 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043b3cb;
  pcVar19 = vOut->pArray;
  uVar36 = local_74 + 9;
  do {
    uVar8 = uVar36;
    uVar23 = uVar8 - 8;
    if (((int)local_74 < 0) || (iVar32 <= (int)(uVar8 - 9))) goto LAB_0043a4a3;
    uVar36 = uVar8 + 1;
  } while (pcVar19[uVar8 - 9] != '\0');
  if (pcVar19 == (char *)0x0) {
    pVVar18 = (Vec_Int_t *)0x0;
  }
  else {
    local_74 = uVar23;
    sVar12 = strlen(pcVar19 + lVar29);
    local_60 = (Vec_Int_t *)malloc(sVar12 + 1);
    strcpy((char *)local_60,pcVar19 + lVar29);
    pVVar18 = local_60;
  }
  *(Vec_Int_t **)local_70 = pVVar18;
  uVar30 = uVar8 - 7;
  uVar23 = uVar30;
  if (iVar32 <= (int)(uVar8 - 8)) goto LAB_0043a4a3;
  uVar33 = uVar8 - 6;
  uVar23 = uVar33;
  if (iVar32 <= (int)uVar30) goto LAB_0043a4a3;
  uVar31 = uVar8 - 5;
  uVar23 = uVar31;
  if (iVar32 <= (int)uVar33) goto LAB_0043a4a3;
  uVar24 = uVar8 - 4;
  uVar23 = uVar24;
  if (iVar32 <= (int)uVar31) goto LAB_0043a4a3;
  *(uint *)(local_70 + 8) =
       CONCAT13(pcVar19[uVar31],
                CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar8 - 8])));
  uVar30 = uVar8 - 3;
  uVar23 = uVar30;
  if (iVar32 <= (int)uVar24) goto LAB_0043a4a3;
  uVar33 = uVar8 - 2;
  uVar23 = uVar33;
  if (iVar32 <= (int)uVar30) goto LAB_0043a4a3;
  uVar31 = uVar8 - 1;
  uVar23 = uVar31;
  if ((iVar32 <= (int)uVar33) || (uVar23 = uVar8, iVar32 <= (int)uVar31)) goto LAB_0043a4a3;
  *(uint *)(local_70 + 0xc) =
       CONCAT13(pcVar19[uVar31],CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar24])))
  ;
  bVar22 = 0;
  uVar30 = 0;
  local_74 = uVar36;
  while( true ) {
    uVar23 = local_74;
    if (iVar32 <= (int)uVar8) goto LAB_0043a4a3;
    bVar1 = pcVar19[uVar8];
    if (-1 < (char)bVar1) break;
    uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar8 + 2;
    uVar8 = uVar8 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar36 < 0) goto LAB_0043a4a3;
  }
  uVar30 = (uint)bVar1 << (bVar22 & 0x1f) | uVar30;
  if (uVar30 != 0) {
    local_60 = (Vec_Int_t *)(local_70 + 0x10);
    do {
      uVar36 = local_74 + 1;
      uVar23 = uVar36;
      if ((int)local_74 < 0) goto LAB_0043a4a3;
      uVar8 = vOut->nSize;
      if (vOut->nSize <= (int)local_74) {
        uVar8 = local_74;
      }
      bVar22 = 0;
      uVar31 = 0;
      uVar33 = local_74;
      local_74 = uVar36;
      while( true ) {
        uVar23 = local_74;
        if (uVar8 == uVar33) goto LAB_0043a4a3;
        bVar1 = vOut->pArray[uVar33];
        if (-1 < (char)bVar1) break;
        uVar31 = uVar31 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
        local_74 = uVar33 + 2;
        uVar33 = uVar33 + 1;
        bVar22 = bVar22 + 7;
        uVar23 = local_74;
        if ((int)uVar36 < 0) goto LAB_0043a4a3;
      }
      Vec_IntPush(local_60,(uint)bVar1 << (bVar22 & 0x1f) | uVar31);
      uVar26 = (ulong)local_74;
      uVar36 = local_74 + 1;
      uVar23 = uVar36;
      if (((int)local_74 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043a4a3;
      pcVar19 = vOut->pArray;
      cVar2 = pcVar19[uVar26];
      uVar8 = (uint)(uVar26 + 2);
      uVar23 = uVar8;
      if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
      cVar3 = pcVar19[uVar36];
      uVar36 = (uint)(uVar26 + 3);
      uVar23 = uVar36;
      if (iVar32 <= (int)uVar8) goto LAB_0043a4a3;
      cVar4 = pcVar19[uVar26 + 2];
      local_74 = local_74 + 4;
      uVar23 = local_74;
      if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
      cVar5 = pcVar19[uVar26 + 3];
      uVar23 = *(uint *)(local_70 + 0x20);
      if (*(uint *)(local_70 + 0x24) == uVar23) {
        if ((int)uVar23 < 0x10) {
          if (*(void **)(local_70 + 0x28) == (void *)0x0) {
            pvVar15 = malloc(0x40);
          }
          else {
            pvVar15 = realloc(*(void **)(local_70 + 0x28),0x40);
          }
          iVar32 = 0x10;
        }
        else {
          iVar32 = uVar23 * 2;
          if (iVar32 <= (int)uVar23) goto LAB_00439eef;
          if (*(void **)(local_70 + 0x28) == (void *)0x0) {
            pvVar15 = malloc((ulong)uVar23 << 3);
          }
          else {
            pvVar15 = realloc(*(void **)(local_70 + 0x28),(ulong)uVar23 << 3);
          }
        }
        *(void **)(local_70 + 0x28) = pvVar15;
        *(int *)(local_70 + 0x20) = iVar32;
      }
LAB_00439eef:
      iVar32 = *(int *)(local_70 + 0x24);
      *(int *)(local_70 + 0x24) = iVar32 + 1;
      *(uint *)(*(long *)(local_70 + 0x28) + (long)iVar32 * 4) =
           CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
      uVar30 = uVar30 - 1;
      vOut = local_48;
    } while (uVar30 != 0);
  }
  uVar30 = (int)local_68 - 1;
  uVar36 = local_74;
  goto joined_r0x00439b4c;
LAB_00439f4b:
  uVar8 = uVar36 + 1;
  uVar23 = uVar8;
  if (-1 < (int)uVar36) {
    uVar30 = vOut->nSize;
    if (vOut->nSize <= (int)uVar36) {
      uVar30 = uVar36;
    }
    bVar22 = 0;
    uVar33 = 0;
    local_74 = uVar8;
    do {
      uVar23 = local_74;
      if (uVar30 == uVar36) break;
      bVar1 = vOut->pArray[uVar36];
      if (-1 < (char)bVar1) {
        uVar33 = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
        uVar36 = local_74;
        goto joined_r0x00439fab;
      }
      uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
      local_74 = uVar36 + 2;
      uVar36 = uVar36 + 1;
      bVar22 = bVar22 + 7;
      uVar23 = local_74;
    } while (-1 < (int)uVar8);
  }
  goto LAB_0043a4a3;
joined_r0x00439fab:
  if (uVar33 == 0) goto LAB_0043a456;
  local_60._4_4_ = (undefined4)((ulong)local_60 >> 0x20);
  local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,uVar33);
  local_74 = uVar36;
  local_70 = (char *)calloc(1,0x38);
  uVar23 = (local_58->vWireLoadSels).nCap;
  if ((local_58->vWireLoadSels).nSize == uVar23) {
    if ((int)uVar23 < 0x10) {
      ppvVar14 = (local_58->vWireLoadSels).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,0x80);
      }
      iVar32 = 0x10;
    }
    else {
      iVar32 = uVar23 * 2;
      if (iVar32 <= (int)uVar23) goto LAB_0043a038;
      ppvVar14 = (local_58->vWireLoadSels).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar23 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,(ulong)uVar23 << 4);
      }
    }
    (local_58->vWireLoadSels).pArray = ppvVar14;
    (local_58->vWireLoadSels).nCap = iVar32;
  }
LAB_0043a038:
  iVar32 = (local_58->vWireLoadSels).nSize;
  (local_58->vWireLoadSels).nSize = iVar32 + 1;
  (local_58->vWireLoadSels).pArray[iVar32] = local_70;
  lVar29 = (long)(int)local_74;
  if ((lVar29 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043b3cb;
  pcVar19 = vOut->pArray;
  uVar36 = local_74;
  uVar23 = local_74;
  do {
    uVar8 = uVar23;
    uVar36 = uVar36 + 1;
    uVar23 = uVar8 + 1;
    if (((int)local_74 < 0) || (iVar32 <= (int)uVar8)) goto LAB_0043a4a3;
  } while (pcVar19[uVar8] != '\0');
  if (pcVar19 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    local_74 = uVar23;
    sVar12 = strlen(pcVar19 + lVar29);
    local_68 = (char *)malloc(sVar12 + 1);
    strcpy(local_68,pcVar19 + lVar29);
    pcVar13 = local_68;
  }
  *(char **)local_70 = pcVar13;
  bVar22 = 0;
  uVar30 = 0;
  local_74 = uVar8 + 2;
  while( true ) {
    uVar23 = local_74;
    if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
    bVar1 = pcVar19[uVar36];
    if (-1 < (char)bVar1) break;
    uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar36 + 2;
    uVar36 = uVar36 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)(uVar8 + 2) < 0) goto LAB_0043a4a3;
  }
  pcVar19 = local_70;
  for (uVar30 = (uint)bVar1 << (bVar22 & 0x1f) | uVar30; uVar30 != 0; uVar30 = uVar30 - 1) {
    uVar26 = (ulong)local_74;
    uVar36 = local_74 + 1;
    uVar23 = uVar36;
    if (((int)local_74 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043a4a3;
    pcVar13 = vOut->pArray;
    cVar2 = pcVar13[uVar26];
    uVar8 = (uint)(uVar26 + 2);
    uVar23 = uVar8;
    if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
    cVar3 = pcVar13[uVar36];
    uVar36 = (uint)(uVar26 + 3);
    uVar23 = uVar36;
    if (iVar32 <= (int)uVar8) goto LAB_0043a4a3;
    cVar4 = pcVar13[uVar26 + 2];
    local_74 = local_74 + 4;
    uVar23 = local_74;
    if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
    cVar5 = pcVar13[uVar26 + 3];
    uVar23 = *(uint *)(pcVar19 + 8);
    if (*(uint *)(pcVar19 + 0xc) == uVar23) {
      if ((int)uVar23 < 0x10) {
        if (*(void **)(pcVar19 + 0x10) == (void *)0x0) {
          pvVar15 = malloc(0x40);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x10),0x40);
        }
        iVar32 = 0x10;
      }
      else {
        iVar32 = uVar23 * 2;
        if (iVar32 <= (int)uVar23) goto LAB_0043a1f3;
        if (*(void **)(pcVar19 + 0x10) == (void *)0x0) {
          pvVar15 = malloc((ulong)uVar23 << 3);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x10),(ulong)uVar23 << 3);
        }
      }
      *(void **)(local_70 + 0x10) = pvVar15;
      *(int *)(local_70 + 8) = iVar32;
      pcVar19 = local_70;
    }
LAB_0043a1f3:
    iVar32 = *(int *)(pcVar19 + 0xc);
    *(int *)(pcVar19 + 0xc) = iVar32 + 1;
    *(uint *)(*(long *)(pcVar19 + 0x10) + (long)iVar32 * 4) =
         CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
    uVar26 = (ulong)local_74;
    uVar36 = local_74 + 1;
    uVar23 = uVar36;
    if (((int)local_74 < 0) || (iVar32 = local_48->nSize, iVar32 <= (int)local_74))
    goto LAB_0043a4a3;
    pcVar13 = local_48->pArray;
    cVar2 = pcVar13[uVar26];
    uVar8 = (uint)(uVar26 + 2);
    uVar23 = uVar8;
    if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
    cVar3 = pcVar13[uVar36];
    uVar36 = (uint)(uVar26 + 3);
    uVar23 = uVar36;
    if (iVar32 <= (int)uVar8) goto LAB_0043a4a3;
    cVar4 = pcVar13[uVar26 + 2];
    local_74 = local_74 + 4;
    uVar23 = local_74;
    if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
    cVar5 = pcVar13[uVar26 + 3];
    uVar23 = *(uint *)(pcVar19 + 0x18);
    if (*(uint *)(pcVar19 + 0x1c) == uVar23) {
      if ((int)uVar23 < 0x10) {
        if (*(void **)(pcVar19 + 0x20) == (void *)0x0) {
          pvVar15 = malloc(0x40);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x20),0x40);
        }
        iVar32 = 0x10;
      }
      else {
        iVar32 = uVar23 * 2;
        if (iVar32 <= (int)uVar23) goto LAB_0043a2ee;
        if (*(void **)(pcVar19 + 0x20) == (void *)0x0) {
          pvVar15 = malloc((ulong)uVar23 << 3);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x20),(ulong)uVar23 << 3);
        }
      }
      *(void **)(local_70 + 0x20) = pvVar15;
      *(int *)(local_70 + 0x18) = iVar32;
      pcVar19 = local_70;
    }
LAB_0043a2ee:
    iVar32 = *(int *)(pcVar19 + 0x1c);
    *(int *)(pcVar19 + 0x1c) = iVar32 + 1;
    *(uint *)(*(long *)(pcVar19 + 0x20) + (long)iVar32 * 4) =
         CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
    lVar29 = (long)(int)local_74;
    if ((lVar29 < 0) || (local_48->nSize <= (int)local_74)) goto LAB_0043b3cb;
    pcVar13 = local_48->pArray;
    uVar36 = local_74;
    do {
      uVar23 = uVar36 + 1;
      if (((int)local_74 < 0) || (local_48->nSize <= (int)uVar36)) goto LAB_0043a4a3;
      uVar26 = (ulong)uVar36;
      uVar36 = uVar23;
    } while (pcVar13[uVar26] != '\0');
    local_74 = uVar23;
    if (pcVar13 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar13 + lVar29);
      pcVar16 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar16,pcVar13 + lVar29);
      pcVar19 = local_70;
    }
    uVar23 = *(uint *)(pcVar19 + 0x28);
    if (*(uint *)(pcVar19 + 0x2c) == uVar23) {
      if ((int)uVar23 < 0x10) {
        if (*(void **)(pcVar19 + 0x30) == (void *)0x0) {
          pvVar15 = malloc(0x80);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x30),0x80);
        }
        iVar32 = 0x10;
      }
      else {
        iVar32 = uVar23 * 2;
        if (iVar32 <= (int)uVar23) goto LAB_0043a3f2;
        if (*(void **)(pcVar19 + 0x30) == (void *)0x0) {
          pvVar15 = malloc((ulong)uVar23 << 4);
        }
        else {
          pvVar15 = realloc(*(void **)(pcVar19 + 0x30),(ulong)uVar23 << 4);
        }
      }
      *(void **)(local_70 + 0x30) = pvVar15;
      *(int *)(local_70 + 0x28) = iVar32;
      pcVar19 = local_70;
    }
LAB_0043a3f2:
    iVar32 = *(int *)(pcVar19 + 0x2c);
    *(int *)(pcVar19 + 0x2c) = iVar32 + 1;
    *(char **)(*(long *)(pcVar19 + 0x30) + (long)iVar32 * 8) = pcVar16;
    vOut = local_48;
  }
  uVar33 = (int)local_60 - 1;
  uVar36 = local_74;
  goto joined_r0x00439fab;
joined_r0x0043a4c8:
  local_38 = uVar36;
  if (local_38 == 0) {
LAB_0043b38b:
    local_38 = uVar23;
    pSVar11 = local_58;
    if (local_3c == 8) {
      if (local_74 != vOut->nSize) {
        __assert_fail("Pos == Vec_StrSize(vOut)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                      ,0x19b,"SC_Lib *Abc_SclReadFromStr(Vec_Str_t *)");
      }
      Abc_SclHashCells(local_58);
      Abc_SclLinkCells(pSVar11);
    }
    else {
      pSVar11 = (SC_Lib *)0x0;
    }
    return pSVar11;
  }
  plVar17 = (long *)calloc(1,0x70);
  uVar23 = (local_58->vCells).nSize;
  *(uint *)(plVar17 + 1) = uVar23;
  uVar36 = (local_58->vCells).nCap;
  if (uVar23 == uVar36) {
    if ((int)uVar36 < 0x10) {
      ppvVar14 = (local_58->vCells).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc(0x80);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,0x80);
      }
      iVar32 = 0x10;
    }
    else {
      iVar32 = uVar36 * 2;
      if (iVar32 <= (int)uVar36) goto LAB_0043a551;
      ppvVar14 = (local_58->vCells).pArray;
      if (ppvVar14 == (void **)0x0) {
        ppvVar14 = (void **)malloc((ulong)uVar36 << 4);
      }
      else {
        ppvVar14 = (void **)realloc(ppvVar14,(ulong)uVar36 << 4);
      }
    }
    (local_58->vCells).pArray = ppvVar14;
    (local_58->vCells).nCap = iVar32;
  }
LAB_0043a551:
  iVar32 = (local_58->vCells).nSize;
  (local_58->vCells).nSize = iVar32 + 1;
  (local_58->vCells).pArray[iVar32] = plVar17;
  lVar29 = (long)(int)local_74;
  local_50 = plVar17;
  if ((lVar29 < 0) || (uVar36 = vOut->nSize, (int)uVar36 <= (int)local_74)) goto LAB_0043b3cb;
  pcVar19 = vOut->pArray;
  uVar8 = local_74 + 9;
  do {
    uVar30 = uVar8;
    uVar23 = uVar30 - 8;
    if (((int)local_74 < 0) || ((int)uVar36 <= (int)(uVar30 - 9))) goto LAB_0043a4a3;
    uVar8 = uVar30 + 1;
  } while (pcVar19[uVar30 - 9] != '\0');
  if (pcVar19 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    local_74 = uVar23;
    sVar12 = strlen(pcVar19 + lVar29);
    local_70 = (char *)malloc(sVar12 + 1);
    strcpy(local_70,pcVar19 + lVar29);
    pcVar13 = local_70;
  }
  *local_50 = (long)pcVar13;
  uVar33 = uVar30 - 7;
  uVar23 = uVar33;
  if ((int)uVar36 <= (int)(uVar30 - 8)) goto LAB_0043a4a3;
  uVar31 = uVar30 - 6;
  uVar23 = uVar31;
  if ((int)uVar36 <= (int)uVar33) goto LAB_0043a4a3;
  uVar24 = uVar30 - 5;
  uVar23 = uVar24;
  if ((int)uVar36 <= (int)uVar31) goto LAB_0043a4a3;
  uVar25 = uVar30 - 4;
  uVar23 = uVar25;
  if ((int)uVar36 <= (int)uVar24) goto LAB_0043a4a3;
  fVar9 = (float)CONCAT13(pcVar19[uVar24],
                          CONCAT12(pcVar19[uVar31],CONCAT11(pcVar19[uVar33],pcVar19[uVar30 - 8])));
  *(float *)(local_50 + 3) = fVar9;
  uVar33 = uVar30 - 3;
  uVar23 = uVar33;
  if ((int)uVar36 <= (int)uVar25) goto LAB_0043a4a3;
  uVar31 = uVar30 - 2;
  uVar23 = uVar31;
  if ((int)uVar36 <= (int)uVar33) goto LAB_0043a4a3;
  uVar24 = uVar30 - 1;
  uVar23 = uVar24;
  if (((int)uVar36 <= (int)uVar31) || (uVar23 = uVar30, (int)uVar36 <= (int)uVar24))
  goto LAB_0043a4a3;
  fVar10 = (float)CONCAT13(pcVar19[uVar24],
                           CONCAT12(pcVar19[uVar31],CONCAT11(pcVar19[uVar33],pcVar19[uVar25])));
  *(float *)((long)local_50 + 0x1c) = fVar10;
  bVar22 = 0;
  uVar33 = 0;
  local_74 = uVar8;
  while( true ) {
    uVar23 = local_74;
    if ((int)uVar36 <= (int)uVar30) goto LAB_0043a4a3;
    bVar1 = pcVar19[uVar30];
    if (-1 < (char)bVar1) break;
    uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar30 + 2;
    uVar30 = uVar30 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar8 < 0) goto LAB_0043a4a3;
  }
  *(uint *)(local_50 + 5) = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
  uVar8 = local_74 + 1;
  uVar23 = uVar8;
  if ((int)local_74 < 0) goto LAB_0043a4a3;
  uVar30 = local_74;
  if ((int)local_74 < (int)uVar36) {
    uVar30 = uVar36;
  }
  bVar22 = 0;
  uVar31 = 0;
  uVar33 = local_74;
  local_74 = uVar8;
  while( true ) {
    uVar23 = local_74;
    if (uVar30 == uVar33) goto LAB_0043a4a3;
    bVar1 = pcVar19[uVar33];
    if (-1 < (char)bVar1) break;
    uVar31 = uVar31 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar33 + 2;
    uVar33 = uVar33 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar8 < 0) goto LAB_0043a4a3;
  }
  uVar31 = (uint)bVar1 << (bVar22 & 0x1f) | uVar31;
  *(uint *)(local_50 + 8) = uVar31;
  uVar8 = local_74 + 1;
  uVar23 = uVar8;
  if ((int)local_74 < 0) goto LAB_0043a4a3;
  if ((int)uVar36 <= (int)local_74) {
    uVar36 = local_74;
  }
  bVar22 = 0;
  uVar33 = 0;
  uVar30 = local_74;
  local_74 = uVar8;
  while( true ) {
    uVar23 = local_74;
    if (uVar36 == uVar30) goto LAB_0043a4a3;
    bVar1 = pcVar19[uVar30];
    if (-1 < (char)bVar1) break;
    uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
    local_74 = uVar30 + 2;
    uVar30 = uVar30 + 1;
    bVar22 = bVar22 + 7;
    uVar23 = local_74;
    if ((int)uVar8 < 0) goto LAB_0043a4a3;
  }
  *(uint *)((long)local_50 + 0x44) = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
  *(int *)(local_50 + 4) = (int)(fVar9 * 1000.0);
  *(int *)((long)local_50 + 0x24) = (int)(fVar10 * 1000.0);
  if (0 < (int)uVar31) {
    iVar32 = 0;
    do {
      plVar17 = local_50;
      pVVar18 = (Vec_Int_t *)calloc(1,0x50);
      pVVar18[2].nSize = -0x40800000;
      uVar23 = *(uint *)(plVar17 + 6);
      if (*(uint *)((long)plVar17 + 0x34) == uVar23) {
        if ((int)uVar23 < 0x10) {
          if ((void *)plVar17[7] == (void *)0x0) {
            pvVar15 = malloc(0x80);
          }
          else {
            pvVar15 = realloc((void *)plVar17[7],0x80);
          }
          iVar28 = 0x10;
        }
        else {
          iVar28 = uVar23 * 2;
          if (iVar28 <= (int)uVar23) goto LAB_0043a894;
          if ((void *)plVar17[7] == (void *)0x0) {
            pvVar15 = malloc((ulong)uVar23 << 4);
          }
          else {
            pvVar15 = realloc((void *)plVar17[7],(ulong)uVar23 << 4);
          }
        }
        plVar17[7] = (long)pvVar15;
        *(int *)(plVar17 + 6) = iVar28;
      }
LAB_0043a894:
      iVar28 = *(int *)((long)plVar17 + 0x34);
      *(int *)((long)plVar17 + 0x34) = iVar28 + 1;
      *(Vec_Int_t **)(plVar17[7] + (long)iVar28 * 8) = pVVar18;
      *(undefined4 *)&pVVar18->pArray = 1;
      lVar29 = (long)(int)local_74;
      if ((lVar29 < 0) || (iVar28 = vOut->nSize, iVar28 <= (int)local_74)) goto LAB_0043b3cb;
      pcVar19 = vOut->pArray;
      uVar36 = local_74 + 8;
      do {
        uVar8 = uVar36;
        uVar23 = uVar8 - 7;
        if (((int)local_74 < 0) || (iVar28 <= (int)(uVar8 - 8))) goto LAB_0043a4a3;
        uVar36 = uVar8 + 1;
      } while (pcVar19[uVar8 - 8] != '\0');
      local_70 = (char *)CONCAT44(local_70._4_4_,iVar32);
      if (pcVar19 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        local_74 = uVar23;
        local_60 = pVVar18;
        sVar12 = strlen(pcVar19 + lVar29);
        pcVar13 = (char *)malloc(sVar12 + 1);
        strcpy(pcVar13,pcVar19 + lVar29);
        pVVar18 = local_60;
      }
      *(char **)pVVar18 = pcVar13;
      uVar30 = uVar8 - 6;
      uVar23 = uVar30;
      if (iVar28 <= (int)(uVar8 - 7)) goto LAB_0043a4a3;
      uVar33 = uVar8 - 5;
      uVar23 = uVar33;
      if (iVar28 <= (int)uVar30) goto LAB_0043a4a3;
      uVar31 = uVar8 - 4;
      uVar23 = uVar31;
      if (iVar28 <= (int)uVar33) goto LAB_0043a4a3;
      uVar24 = uVar8 - 3;
      uVar23 = uVar24;
      if (iVar28 <= (int)uVar31) goto LAB_0043a4a3;
      fVar9 = (float)CONCAT13(pcVar19[uVar31],
                              CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar8 - 7]))
                             );
      pVVar18[1].nCap = (int)fVar9;
      uVar30 = uVar8 - 2;
      uVar23 = uVar30;
      if (iVar28 <= (int)uVar24) goto LAB_0043a4a3;
      uVar33 = uVar8 - 1;
      uVar23 = uVar33;
      if (((iVar28 <= (int)uVar30) || (uVar23 = uVar8, iVar28 <= (int)uVar33)) ||
         (uVar23 = uVar36, iVar28 <= (int)uVar8)) goto LAB_0043a4a3;
      fVar10 = (float)CONCAT13(pcVar19[uVar8],
                               CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar24])));
      pVVar18[1].nSize = (int)fVar10;
      *(int *)&pVVar18[1].pArray = (int)(fVar9 * 1000.0);
      *(int *)((long)&pVVar18[1].pArray + 4) = (int)(fVar10 * 1000.0);
      iVar32 = (int)local_70 + 1;
      local_74 = uVar36;
    } while (iVar32 < (int)local_50[8]);
  }
  if (0 < *(int *)((long)local_50 + 0x44)) {
    iVar32 = 0;
    plVar17 = local_50;
    do {
      local_34 = iVar32;
      pcVar19 = (char *)calloc(1,0x50);
      pcVar19[0x24] = '\0';
      pcVar19[0x25] = '\0';
      pcVar19[0x26] = -0x80;
      pcVar19[0x27] = -0x41;
      uVar23 = *(uint *)(plVar17 + 6);
      if (*(uint *)((long)plVar17 + 0x34) == uVar23) {
        if ((int)uVar23 < 0x10) {
          if ((void *)plVar17[7] == (void *)0x0) {
            pvVar15 = malloc(0x80);
          }
          else {
            pvVar15 = realloc((void *)plVar17[7],0x80);
          }
          iVar32 = 0x10;
        }
        else {
          iVar32 = uVar23 * 2;
          if (iVar32 <= (int)uVar23) goto LAB_0043aaf7;
          if ((void *)plVar17[7] == (void *)0x0) {
            pvVar15 = malloc((ulong)uVar23 << 4);
          }
          else {
            pvVar15 = realloc((void *)plVar17[7],(ulong)uVar23 << 4);
          }
        }
        plVar17[7] = (long)pvVar15;
        *(int *)(plVar17 + 6) = iVar32;
      }
LAB_0043aaf7:
      iVar32 = *(int *)((long)plVar17 + 0x34);
      *(int *)((long)plVar17 + 0x34) = iVar32 + 1;
      *(char **)(plVar17[7] + (long)iVar32 * 8) = pcVar19;
      pcVar19[8] = '\x02';
      pcVar19[9] = '\0';
      pcVar19[10] = '\0';
      pcVar19[0xb] = '\0';
      lVar29 = (long)(int)local_74;
      local_68 = pcVar19;
      if ((lVar29 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043b3cb;
      pcVar19 = vOut->pArray;
      uVar36 = local_74 + 9;
      do {
        uVar8 = uVar36;
        uVar23 = uVar8 - 8;
        if (((int)local_74 < 0) || (iVar32 <= (int)(uVar8 - 9))) goto LAB_0043a4a3;
        uVar36 = uVar8 + 1;
      } while (pcVar19[uVar8 - 9] != '\0');
      if (pcVar19 == (char *)0x0) {
        pVVar18 = (Vec_Int_t *)0x0;
      }
      else {
        local_74 = uVar23;
        local_70 = pcVar19 + lVar29;
        sVar12 = strlen(pcVar19 + lVar29);
        local_60 = (Vec_Int_t *)malloc(sVar12 + 1);
        strcpy((char *)local_60,local_70);
        pVVar18 = local_60;
      }
      *(Vec_Int_t **)local_68 = pVVar18;
      uVar30 = uVar8 - 7;
      uVar23 = uVar30;
      if (iVar32 <= (int)(uVar8 - 8)) goto LAB_0043a4a3;
      uVar33 = uVar8 - 6;
      uVar23 = uVar33;
      if (iVar32 <= (int)uVar30) goto LAB_0043a4a3;
      uVar31 = uVar8 - 5;
      uVar23 = uVar31;
      if (iVar32 <= (int)uVar33) goto LAB_0043a4a3;
      uVar24 = uVar8 - 4;
      uVar23 = uVar24;
      if (iVar32 <= (int)uVar31) goto LAB_0043a4a3;
      *(uint *)(local_68 + 0x20) =
           CONCAT13(pcVar19[uVar31],
                    CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar8 - 8])));
      uVar30 = uVar8 - 3;
      uVar23 = uVar30;
      if (iVar32 <= (int)uVar24) goto LAB_0043a4a3;
      uVar33 = uVar8 - 2;
      uVar23 = uVar33;
      if (iVar32 <= (int)uVar30) goto LAB_0043a4a3;
      uVar31 = uVar8 - 1;
      uVar23 = uVar31;
      if ((iVar32 <= (int)uVar33) || (uVar23 = uVar8, iVar32 <= (int)uVar31)) goto LAB_0043a4a3;
      *(uint *)(local_68 + 0x24) =
           CONCAT13(pcVar19[uVar31],
                    CONCAT12(pcVar19[uVar33],CONCAT11(pcVar19[uVar30],pcVar19[uVar24])));
      bVar22 = 0;
      uVar30 = 0;
      local_74 = uVar36;
      while( true ) {
        uVar23 = local_74;
        if (iVar32 <= (int)uVar8) goto LAB_0043a4a3;
        bVar1 = pcVar19[uVar8];
        if (-1 < (char)bVar1) break;
        uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
        local_74 = uVar8 + 2;
        uVar8 = uVar8 + 1;
        bVar22 = bVar22 + 7;
        uVar23 = local_74;
        if ((int)uVar36 < 0) goto LAB_0043a4a3;
      }
      local_70 = (char *)(ulong)*(uint *)(plVar17 + 8);
      if (((uint)bVar1 << (bVar22 & 0x1f) | uVar30) != *(uint *)(plVar17 + 8)) {
        __assert_fail("k == pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                      ,0x14f,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
      }
      if (*(long *)(local_68 + 0x28) != 0) {
        __assert_fail("pPin->func_text == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                      ,0x154,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
      }
      lVar29 = (long)(int)local_74;
      if ((lVar29 < 0) || (iVar32 <= (int)local_74)) goto LAB_0043b3cb;
      uVar36 = local_74;
      do {
        uVar23 = uVar36 + 1;
        if (((int)local_74 < 0) || (iVar32 <= (int)uVar36)) goto LAB_0043a4a3;
        uVar26 = (ulong)uVar36;
        uVar36 = uVar23;
      } while (pcVar19[uVar26] != '\0');
      local_74 = uVar23;
      if (pcVar19 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        sVar12 = strlen(pcVar19 + lVar29);
        pcVar13 = (char *)malloc(sVar12 + 1);
        strcpy(pcVar13,pcVar19 + lVar29);
      }
      pcVar19 = local_68;
      *(char **)(local_68 + 0x28) = pcVar13;
      if (*pcVar13 == '\0') {
        free(pcVar13);
        pcVar19[0x28] = '\0';
        pcVar19[0x29] = '\0';
        pcVar19[0x2a] = '\0';
        pcVar19[0x2b] = '\0';
        pcVar19[0x2c] = '\0';
        pcVar19[0x2d] = '\0';
        pcVar19[0x2e] = '\0';
        pcVar19[0x2f] = '\0';
        if (*(int *)(pcVar19 + 0x34) != 0) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x15a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        pVVar20 = (Vec_Wrd_t *)(pcVar19 + 0x30);
        iVar32 = 1 << ((char)local_70 - 6U & 0x1f);
        if ((int)local_70 < 7) {
          iVar32 = 1;
        }
        if (pVVar20->nCap < iVar32) {
          if (*(void **)(pcVar19 + 0x38) == (void *)0x0) {
            pvVar15 = malloc((long)iVar32 << 3);
          }
          else {
            pvVar15 = realloc(*(void **)(pcVar19 + 0x38),(long)iVar32 << 3);
          }
          *(void **)(pcVar19 + 0x38) = pvVar15;
          if (pvVar15 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar20->nCap = iVar32;
        }
        if (0 < pVVar20->nCap) {
          iVar32 = 0;
          do {
            uVar26 = (ulong)local_74;
            lVar29 = 0;
            uVar27 = 0;
            do {
              uVar23 = (int)uVar26 + 1;
              if (((int)local_74 < 0) || (vOut->nSize <= (int)uVar26)) goto LAB_0043a4a3;
              uVar27 = uVar27 | (ulong)(byte)vOut->pArray[uVar26] << ((byte)lVar29 & 0x3f);
              uVar26 = uVar26 + 1;
              lVar29 = lVar29 + 8;
            } while (lVar29 != 0x40);
            local_74 = uVar23;
            Vec_WrdPush(pVVar20,uVar27);
            iVar32 = iVar32 + 1;
          } while (iVar32 < pVVar20->nCap);
        }
      }
      else {
        __ptr = (uint *)malloc(0x10);
        uVar23 = (uint)local_70;
        uVar36 = uVar23;
        if (uVar23 - 1 < 7) {
          uVar36 = 8;
        }
        __ptr[1] = 0;
        *__ptr = uVar36;
        if (uVar36 == 0) {
          pvVar15 = (void *)0x0;
        }
        else {
          pvVar15 = malloc((long)(int)uVar36 << 3);
        }
        *(void **)(__ptr + 2) = pvVar15;
        if (0 < (int)uVar23) {
          lVar29 = 0;
          do {
            if (*(int *)((long)plVar17 + 0x34) <= lVar29) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar6 = **(undefined8 **)(plVar17[7] + lVar29 * 8);
            uVar23 = __ptr[1];
            uVar36 = *__ptr;
            if (uVar23 == uVar36) {
              if ((int)uVar36 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar15 = malloc(0x80);
                }
                else {
                  pvVar15 = realloc(*(void **)(__ptr + 2),0x80);
                }
                uVar8 = 0x10;
              }
              else {
                uVar8 = uVar36 * 2;
                if ((int)uVar8 <= (int)uVar36) goto LAB_0043ae94;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar15 = malloc((ulong)uVar36 << 4);
                }
                else {
                  pvVar15 = realloc(*(void **)(__ptr + 2),(ulong)uVar36 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar15;
              *__ptr = uVar8;
            }
LAB_0043ae94:
            __ptr[1] = uVar23 + 1;
            *(undefined8 *)(*(long *)(__ptr + 2) + (long)(int)uVar23 * 8) = uVar6;
            lVar29 = lVar29 + 1;
            pcVar19 = local_68;
          } while (lVar29 < (int)plVar17[8]);
        }
        if (*(int *)(pcVar19 + 0x34) != 0) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x16a,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if (*(void **)(pcVar19 + 0x38) != (void *)0x0) {
          free(*(void **)(pcVar19 + 0x38));
          pcVar19[0x38] = '\0';
          pcVar19[0x39] = '\0';
          pcVar19[0x3a] = '\0';
          pcVar19[0x3b] = '\0';
          pcVar19[0x3c] = '\0';
          pcVar19[0x3d] = '\0';
          pcVar19[0x3e] = '\0';
          pcVar19[0x3f] = '\0';
        }
        pcVar19[0x30] = '\0';
        pcVar19[0x31] = '\0';
        pcVar19[0x32] = '\0';
        pcVar19[0x33] = '\0';
        pcVar19[0x34] = '\0';
        pcVar19[0x35] = '\0';
        pcVar19[0x36] = '\0';
        pcVar19[0x37] = '\0';
        ppVarNames = *(char ***)(__ptr + 2);
        pVVar20 = Mio_ParseFormulaTruth(*(char **)(pcVar19 + 0x28),ppVarNames,(int)plVar17[8]);
        pwVar7 = pVVar20->pArray;
        *(undefined8 *)(pcVar19 + 0x30) = *(undefined8 *)pVVar20;
        *(word **)(pcVar19 + 0x38) = pwVar7;
        if (pVVar20 != (Vec_Wrd_t *)0x0) {
          free(pVVar20);
        }
        vOut = local_48;
        if (ppVarNames != (char **)0x0) {
          free(ppVarNames);
          __ptr[2] = 0;
          __ptr[3] = 0;
        }
        free(__ptr);
        uVar36 = *(uint *)(pcVar19 + 0x34);
        uVar23 = 1 << ((char)(int)plVar17[8] - 6U & 0x1f);
        if ((int)plVar17[8] < 7) {
          uVar23 = 1;
        }
        if (uVar36 != uVar23) {
          __assert_fail("Vec_WrdSize(&pPin->vFunc) == Abc_Truth6WordNum(pCell->n_inputs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                        ,0x171,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
        }
        if (0 < (int)uVar36) {
          uVar27 = 0;
          uVar26 = (ulong)local_74;
          do {
            uVar34 = uVar26 & 0xffffffff;
            lVar29 = 0;
            uVar35 = 0;
            do {
              local_74 = (int)uVar34 + 1;
              uVar23 = local_74;
              if (((int)uVar26 < 0) || (vOut->nSize <= (int)uVar34)) goto LAB_0043a4a3;
              uVar35 = uVar35 | (ulong)(byte)vOut->pArray[uVar34] << ((byte)lVar29 & 0x3f);
              uVar34 = uVar34 + 1;
              lVar29 = lVar29 + 8;
            } while (lVar29 != 0x40);
            if (uVar35 != *(ulong *)(*(long *)(pcVar19 + 0x38) + uVar27 * 8)) {
              pcVar16 = "Value == Vec_WrdEntry(&pPin->vFunc, k)";
              pcVar13 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
              ;
              pcVar19 = "int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)";
              goto LAB_0043b3e0;
            }
            uVar27 = uVar27 + 1;
            uVar26 = uVar34;
          } while (uVar27 != uVar36);
        }
      }
      if (0 < (int)plVar17[8]) {
        iVar32 = 0;
        do {
          local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,iVar32);
          pcVar13 = (char *)calloc(1,0x18);
          uVar23 = *(uint *)(pcVar19 + 0x40);
          if (*(uint *)(pcVar19 + 0x44) == uVar23) {
            if ((int)uVar23 < 0x10) {
              if (*(void **)(pcVar19 + 0x48) == (void *)0x0) {
                pvVar15 = malloc(0x80);
              }
              else {
                pvVar15 = realloc(*(void **)(pcVar19 + 0x48),0x80);
              }
              iVar32 = 0x10;
            }
            else {
              iVar32 = uVar23 * 2;
              if (iVar32 <= (int)uVar23) goto LAB_0043b0c5;
              if (*(void **)(pcVar19 + 0x48) == (void *)0x0) {
                pvVar15 = malloc((ulong)uVar23 << 4);
              }
              else {
                pvVar15 = realloc(*(void **)(pcVar19 + 0x48),(ulong)uVar23 << 4);
              }
            }
            *(void **)(pcVar19 + 0x48) = pvVar15;
            *(int *)(pcVar19 + 0x40) = iVar32;
          }
LAB_0043b0c5:
          iVar32 = *(int *)(pcVar19 + 0x44);
          *(int *)(pcVar19 + 0x44) = iVar32 + 1;
          *(char **)(*(long *)(pcVar19 + 0x48) + (long)iVar32 * 8) = pcVar13;
          lVar29 = (long)(int)local_74;
          if ((lVar29 < 0) || (iVar32 = vOut->nSize, iVar32 <= (int)local_74)) goto LAB_0043b3cb;
          pcVar19 = vOut->pArray;
          uVar36 = local_74;
          uVar23 = local_74;
          do {
            uVar8 = uVar23;
            uVar36 = uVar36 + 1;
            uVar23 = uVar8 + 1;
            if (((int)local_74 < 0) || (iVar32 <= (int)uVar8)) goto LAB_0043a4a3;
          } while (pcVar19[uVar8] != '\0');
          local_70 = pcVar13;
          if (pcVar19 == (char *)0x0) {
            pcVar13 = (char *)0x0;
          }
          else {
            local_74 = uVar23;
            sVar12 = strlen(pcVar19 + lVar29);
            pcVar13 = (char *)malloc(sVar12 + 1);
            strcpy(pcVar13,pcVar19 + lVar29);
          }
          pcVar16 = local_70;
          *(char **)local_70 = pcVar13;
          bVar22 = 0;
          uVar30 = 0;
          local_74 = uVar8 + 2;
          while( true ) {
            uVar23 = local_74;
            if (iVar32 <= (int)uVar36) goto LAB_0043a4a3;
            bVar1 = pcVar19[uVar36];
            if (-1 < (char)bVar1) break;
            uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
            local_74 = uVar36 + 2;
            uVar36 = uVar36 + 1;
            bVar22 = bVar22 + 7;
            uVar23 = local_74;
            if ((int)(uVar8 + 2) < 0) goto LAB_0043a4a3;
          }
          uVar30 = (uint)bVar1 << (bVar22 & 0x1f) | uVar30;
          if (1 < (int)uVar30) {
            __assert_fail("n <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                          ,0x180,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
          }
          if (uVar30 == 1) {
            pvVar15 = calloc(1,0x2d8);
            plVar17 = local_50;
            pcVar19 = local_68;
            uVar23 = *(uint *)(pcVar16 + 8);
            if (*(uint *)(pcVar16 + 0xc) == uVar23) {
              if ((int)uVar23 < 0x10) {
                if (*(void **)(pcVar16 + 0x10) == (void *)0x0) {
                  pvVar21 = malloc(0x80);
                }
                else {
                  pvVar21 = realloc(*(void **)(pcVar16 + 0x10),0x80);
                }
                *(void **)(pcVar16 + 0x10) = pvVar21;
                iVar32 = 0x10;
              }
              else {
                iVar32 = uVar23 * 2;
                if (iVar32 <= (int)uVar23) goto LAB_0043b276;
                if (*(void **)(pcVar16 + 0x10) == (void *)0x0) {
                  pvVar21 = malloc((ulong)uVar23 << 4);
                }
                else {
                  pvVar21 = realloc(*(void **)(pcVar16 + 0x10),(ulong)uVar23 << 4);
                }
                *(void **)(pcVar16 + 0x10) = pvVar21;
              }
              *(int *)(pcVar16 + 8) = iVar32;
            }
LAB_0043b276:
            vOut = local_48;
            iVar32 = *(int *)(pcVar16 + 0xc);
            *(int *)(pcVar16 + 0xc) = iVar32 + 1;
            *(void **)(*(long *)(pcVar16 + 0x10) + (long)iVar32 * 8) = pvVar15;
            uVar36 = local_74 + 1;
            uVar23 = uVar36;
            if ((int)local_74 < 0) goto LAB_0043a4a3;
            uVar8 = local_48->nSize;
            if (local_48->nSize <= (int)local_74) {
              uVar8 = local_74;
            }
            bVar22 = 0;
            uVar33 = 0;
            uVar30 = local_74;
            local_74 = uVar36;
            while( true ) {
              uVar23 = local_74;
              if (uVar8 == uVar30) goto LAB_0043a4a3;
              bVar1 = local_48->pArray[uVar30];
              if (-1 < (char)bVar1) break;
              uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
              local_74 = uVar30 + 2;
              uVar30 = uVar30 + 1;
              bVar22 = bVar22 + 7;
              uVar23 = local_74;
              if ((int)uVar36 < 0) goto LAB_0043a4a3;
            }
            *(uint *)((long)pvVar15 + 8) = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
            Abc_SclReadSurface(local_48,(int *)&local_74,(SC_Surface *)((long)pvVar15 + 0x18));
            Abc_SclReadSurface(vOut,(int *)&local_74,(SC_Surface *)((long)pvVar15 + 200));
            Abc_SclReadSurface(vOut,(int *)&local_74,(SC_Surface *)((long)pvVar15 + 0x178));
            Abc_SclReadSurface(vOut,(int *)&local_74,(SC_Surface *)((long)pvVar15 + 0x228));
          }
          else {
            pcVar19 = local_68;
            plVar17 = local_50;
            vOut = local_48;
            if (*(int *)(local_70 + 0xc) != 0) {
              __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                            ,0x18d,"int Abc_SclReadLibrary(Vec_Str_t *, int *, SC_Lib *)");
            }
          }
          iVar32 = (int)local_60 + 1;
        } while (iVar32 < (int)plVar17[8]);
      }
      iVar32 = local_34 + 1;
    } while (iVar32 < *(int *)((long)plVar17 + 0x44));
  }
  uVar36 = local_38 - 1;
  uVar23 = local_38;
  goto joined_r0x0043a4c8;
  while (uVar27 = (ulong)local_74, local_74 = uVar30, pcVar19[uVar27] != '\0') {
LAB_0043982d:
    uVar30 = local_74 + 1;
    uVar23 = uVar30;
    if (uVar8 == local_74) goto LAB_0043a4a3;
  }
  if (pcVar19 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar19 + uVar26);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar19 + uVar26);
  }
  local_58->pName = pcVar13;
  if ((int)uVar30 < (int)uVar36) {
    uVar8 = local_74;
    if (local_74 < uVar36) {
      uVar8 = uVar36;
    }
    do {
      uVar33 = local_74 + 1;
      uVar23 = uVar33;
      if (uVar8 == local_74) goto LAB_0043a4a3;
      uVar26 = (ulong)local_74;
      local_74 = uVar33;
    } while (pcVar19[uVar26] != '\0');
    if (pcVar19 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar19 + uVar30);
      pcVar13 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar13,pcVar19 + uVar30);
    }
    local_58->default_wire_load = pcVar13;
    if ((int)uVar33 < (int)uVar36) {
      uVar8 = local_74;
      if (local_74 < uVar36) {
        uVar8 = uVar36;
      }
      uVar30 = local_74 - 1;
      do {
        uVar31 = uVar30;
        local_74 = uVar31 + 2;
        uVar23 = local_74;
        if (uVar31 - uVar8 == -1) goto LAB_0043a4a3;
        uVar30 = uVar31 + 1;
      } while (pcVar19[uVar30] != '\0');
      if (pcVar19 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        sVar12 = strlen(pcVar19 + uVar33);
        pcVar13 = (char *)malloc(sVar12 + 1);
        strcpy(pcVar13,pcVar19 + uVar33);
      }
      local_58->default_wire_load_sel = pcVar13;
      uVar8 = uVar31 + 3;
      uVar23 = uVar8;
      if ((-2 < (int)uVar30) && ((int)(uVar31 + 2) < (int)uVar36)) {
        uVar33 = uVar31 + 4;
        uVar23 = uVar33;
        if ((int)uVar8 < (int)uVar36) {
          uVar24 = uVar31 + 5;
          uVar23 = uVar24;
          if ((int)uVar33 < (int)uVar36) {
            uVar23 = uVar31 + 6;
            if ((int)uVar24 < (int)uVar36) {
              local_58->default_max_out_slew =
                   (float)CONCAT13(pcVar19[uVar24],
                                   CONCAT12(pcVar19[uVar33],
                                            CONCAT11(pcVar19[uVar8],pcVar19[uVar31 + 2])));
              uVar8 = uVar31 + 7;
              uVar23 = uVar8;
              if (-6 < (int)uVar30) {
                uVar31 = uVar31 + 6;
                bVar22 = 0;
                uVar30 = 0;
                local_74 = uVar8;
                while (uVar23 = local_74, (int)uVar31 < (int)uVar36) {
                  bVar1 = pcVar19[uVar31];
                  if (-1 < (char)bVar1) {
                    local_58->unit_time = (uint)bVar1 << (bVar22 & 0x1f) | uVar30;
                    uVar26 = (ulong)local_74;
                    uVar8 = local_74 + 1;
                    uVar23 = uVar8;
                    if (local_74 < uVar36) {
                      uVar30 = (uint)(uVar26 + 2);
                      uVar23 = uVar30;
                      if ((int)uVar8 < (int)uVar36) {
                        uVar33 = (uint)(uVar26 + 3);
                        uVar23 = uVar33;
                        if ((int)uVar30 < (int)uVar36) {
                          uVar30 = local_74 + 4;
                          uVar23 = uVar30;
                          if ((int)uVar33 < (int)uVar36) {
                            local_58->unit_cap_fst =
                                 (float)CONCAT13(pcVar19[uVar26 + 3],
                                                 CONCAT12(pcVar19[uVar26 + 2],
                                                          CONCAT11(pcVar19[uVar8],pcVar19[uVar26])))
                            ;
                            uVar8 = local_74 + 5;
                            uVar23 = uVar8;
                            if (-5 < (int)local_74) {
                              bVar22 = 0;
                              uVar33 = 0;
                              local_74 = uVar8;
                              goto LAB_00439ab9;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  uVar30 = uVar30 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
                  local_74 = uVar31 + 2;
                  uVar31 = uVar31 + 1;
                  bVar22 = bVar22 + 7;
                  uVar23 = local_74;
                  if ((int)uVar8 < 0) break;
                }
              }
            }
          }
        }
      }
      goto LAB_0043a4a3;
    }
  }
LAB_0043b3cb:
  pcVar16 = "i >= 0 && i < p->nSize";
  pcVar13 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h";
  pcVar19 = "char *Vec_StrEntryP(Vec_Str_t *, int)";
LAB_0043b3e0:
  __assert_fail(pcVar16,pcVar13,0x175,pcVar19);
LAB_0043a456:
  uVar8 = uVar36 + 1;
  uVar23 = uVar8;
  if (-1 < (int)uVar36) {
    uVar30 = vOut->nSize;
    if (vOut->nSize <= (int)uVar36) {
      uVar30 = uVar36;
    }
    bVar22 = 0;
    uVar33 = 0;
    local_74 = uVar8;
    do {
      uVar23 = local_74;
      if (uVar30 == uVar36) break;
      bVar1 = vOut->pArray[uVar36];
      if (-1 < (char)bVar1) {
        uVar36 = (uint)bVar1 << (bVar22 & 0x1f) | uVar33;
        uVar23 = local_38;
        goto joined_r0x0043a4c8;
      }
      uVar33 = uVar33 | (bVar1 & 0x7f) << (bVar22 & 0x1f);
      local_74 = uVar36 + 2;
      uVar36 = uVar36 + 1;
      bVar22 = bVar22 + 7;
      uVar23 = local_74;
    } while (-1 < (int)uVar8);
  }
LAB_0043a4a3:
  local_74 = uVar23;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

SC_Lib * Abc_SclReadFromStr( Vec_Str_t * vOut )
{
    SC_Lib * p;
    int Pos = 0;
    // read the library
    p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibrary( vOut, &Pos, p ) )
        return NULL;
    assert( Pos == Vec_StrSize(vOut) );
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}